

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O0

void __thiscall
ReindexCommand::ReindexCommand
          (ReindexCommand *this,string *dataset_id,
          vector<IndexType,_std::allocator<IndexType>_> *types)

{
  string *in_RSI;
  string *in_RDI;
  vector<IndexType,_std::allocator<IndexType>_> *in_stack_00000018;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(types,in_stack_00000018);
  return;
}

Assistant:

ReindexCommand(const std::string &dataset_id,
                   const std::vector<IndexType> &types)
        : dataset_id_(dataset_id), types_(types) {}